

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_parser_test.cpp
# Opt level: O0

void __thiscall read_ascii_from_string<double>::test_method(read_ascii_from_string<double> *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3c8;
  undefined4 local_3a4;
  size_type local_3a0;
  undefined8 local_391;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_388;
  assertion_result local_378;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  undefined4 local_2fc;
  size_type local_2f8;
  undefined8 local_2e9;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_2e0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_278;
  undefined4 local_254;
  size_type local_250;
  undefined8 local_241;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  local_238;
  assertion_result local_228;
  basic_cstring<const_char> local_210;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1d0;
  undefined1 local_1a9 [9];
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
  local_1a0;
  assertion_result local_190;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  undefined1 *local_158;
  solid *s;
  basic_cstring<const_char> local_140;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_130;
  bool local_109;
  value_expr<bool_&> local_108;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  char *local_c8;
  stl *local_c0;
  undefined1 local_b8 [8];
  pair<tyti::stl::basic_solid<double>,_bool> out;
  allocator<char> local_31;
  string local_30 [8];
  string str;
  read_ascii_from_string<double> *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "solid Hi you\n         facet normal 0.5 0.6 0.7\n        outer loop\n        vertex 0.5 0.6 0.7\n        vertex 0.5 0.6 0.7\n        vertex 0.5 0.6 0.7\n        endloop\n        endfacet\n        endsolid Hi you\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_c0 = (stl *)std::__cxx11::string::begin();
  local_c8 = (char *)std::__cxx11::string::end();
  tyti::stl::read<double,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((pair<tyti::stl::basic_solid<double>,_bool> *)local_b8,local_c0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_c8,in_RCX);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d8,0x1d,&local_e8);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_108,&local_109);
    boost::test_tools::assertion::value_expr<bool_&>::evaluate(&local_100,&local_108,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,"out.second",10);
    boost::unit_test::operator<<(&local_130,plVar3,&local_140);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&s,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_100,&local_130.super_lazy_ostream,(const_string *)&s,0x1d,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_130);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_158 = local_b8;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_178);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_168,0x1f,&local_178);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)(local_1a9 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a9);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string&>,std::__cxx11::string>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string&>,std::__cxx11::string>
                  *)&local_1a0,(char (*) [7])(local_1a9 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
    ::evaluate(&local_190,&local_1a0,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,"s.header == \"Hi you\"",0x14);
    boost::unit_test::operator<<(&local_1d0,plVar3,&local_1e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_190,&local_1d0.super_lazy_ostream,&local_1f0,0x1f,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1d0);
    boost::test_tools::assertion_result::~assertion_result(&local_190);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_210);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_200,0x20,&local_210);
    local_250 = std::
                vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                ::size((vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        *)(local_158 + 0x20));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_241 + 1),&local_241);
    local_254 = 1;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_238,(int *)((long)&local_241 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_228,&local_238,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,"s.normals.size() == 1",0x15);
    boost::unit_test::operator<<(&local_278,plVar3,&local_288);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_228,&local_278.super_lazy_ostream,&local_298,0x20,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_278);
    boost::test_tools::assertion_result::~assertion_result(&local_228);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2a8,0x21,&local_2b8);
    local_2f8 = std::
                vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                ::size((vector<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        *)(local_158 + 0x38));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_2e9 + 1),&local_2e9);
    local_2fc = 3;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_2e0,(int *)((long)&local_2e9 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_2d0,&local_2e0,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"s.vertices.size() == 3",0x16);
    boost::unit_test::operator<<(&local_320,plVar3,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_2d0,&local_320.super_lazy_ostream,&local_340,0x21,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_2d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_350,0x22,&local_360);
    local_3a0 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           (local_158 + 0x50));
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_391 + 1),&local_391);
    local_3a4 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>
                *)&local_388,(int *)((long)&local_391 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
    ::evaluate(&local_378,&local_388,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,"s.attributes.size() == 0",0x18);
    boost::unit_test::operator<<(&local_3c8,plVar3,&local_3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
               ,0x5e);
    boost::test_tools::tt_detail::report_assertion
              (&local_378,&local_3c8.super_lazy_ostream,&local_3e8,0x22,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3c8);
    boost::test_tools::assertion_result::~assertion_result(&local_378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::pair<tyti::stl::basic_solid<double>,_bool>::~pair
            ((pair<tyti::stl::basic_solid<double>,_bool> *)local_b8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(read_ascii_from_string, T, test_types)
{
    using solid = stl::basic_solid<T>;
    std::string str = "solid Hi you\n \
        facet normal 0.5 0.6 0.7\n\
        outer loop\n\
        vertex 0.5 0.6 0.7\n\
        vertex 0.5 0.6 0.7\n\
        vertex 0.5 0.6 0.7\n\
        endloop\n\
        endfacet\n\
        endsolid Hi you\n";

    auto out = stl::read<T>(str.begin(), str.end());

    BOOST_TEST(out.second);
    solid& s = out.first;
    BOOST_TEST(s.header == "Hi you");
    BOOST_TEST(s.normals.size() == 1);
    BOOST_TEST(s.vertices.size() == 3);
    BOOST_TEST(s.attributes.size() == 0);
}